

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int ExpandMatrix(VP8Matrix *m,int type)

{
  byte bVar1;
  int bias;
  int is_ac_coeff;
  int sum;
  int i;
  int type_local;
  VP8Matrix *m_local;
  
  for (i = 0; i < 2; i = i + 1) {
    bVar1 = kBiasMatrices[type][(int)(uint)(0 < i)];
    m->iq_[i] = (uint16_t)(0x20000 / (ulong)(long)(int)(uint)m->q_[i]);
    m->bias_[i] = (uint)bVar1 << 9;
    m->zthresh_[i] = (0x1ffff - m->bias_[i]) / (uint)m->iq_[i];
  }
  for (i = 2; i < 0x10; i = i + 1) {
    m->q_[i] = m->q_[1];
    m->iq_[i] = m->iq_[1];
    m->bias_[i] = m->bias_[1];
    m->zthresh_[i] = m->zthresh_[1];
  }
  sum = 0;
  for (i = 0; i < 0x10; i = i + 1) {
    if (type == 0) {
      m->sharpen_[i] = (uint16_t)((int)((uint)""[i] * (uint)m->q_[i]) >> 0xb);
    }
    else {
      m->sharpen_[i] = 0;
    }
    sum = (uint)m->q_[i] + sum;
  }
  return sum + 8 >> 4;
}

Assistant:

static int ExpandMatrix(VP8Matrix* const m, int type) {
  int i, sum;
  for (i = 0; i < 2; ++i) {
    const int is_ac_coeff = (i > 0);
    const int bias = kBiasMatrices[type][is_ac_coeff];
    m->iq_[i] = (1 << QFIX) / m->q_[i];
    m->bias_[i] = BIAS(bias);
    // zthresh_ is the exact value such that QUANTDIV(coeff, iQ, B) is:
    //   * zero if coeff <= zthresh
    //   * non-zero if coeff > zthresh
    m->zthresh_[i] = ((1 << QFIX) - 1 - m->bias_[i]) / m->iq_[i];
  }
  for (i = 2; i < 16; ++i) {
    m->q_[i] = m->q_[1];
    m->iq_[i] = m->iq_[1];
    m->bias_[i] = m->bias_[1];
    m->zthresh_[i] = m->zthresh_[1];
  }
  for (sum = 0, i = 0; i < 16; ++i) {
    if (type == 0) {  // we only use sharpening for AC luma coeffs
      m->sharpen_[i] = (kFreqSharpening[i] * m->q_[i]) >> SHARPEN_BITS;
    } else {
      m->sharpen_[i] = 0;
    }
    sum += m->q_[i];
  }
  return (sum + 8) >> 4;
}